

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall PClassActor::SetPainChance(PClassActor *this,FName *type,int chance)

{
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *pTVar1;
  int local_2c;
  FName local_28;
  FName local_24;
  
  pTVar1 = this->PainChances;
  if (chance < 0) {
    if (pTVar1 != (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)0x0) {
      local_24 = (FName)type->Index;
      TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::DelKey(pTVar1,&local_24);
    }
  }
  else {
    if (pTVar1 == (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)0x0) {
      pTVar1 = (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)operator_new(0x18);
      pTVar1->NumUsed = 0;
      TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::SetNodeVector(pTVar1,1);
      this->PainChances = pTVar1;
    }
    local_28 = (FName)type->Index;
    local_2c = 0x100;
    if (chance < 0x100) {
      local_2c = chance;
    }
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Insert
              (this->PainChances,&local_28,&local_2c);
  }
  return;
}

Assistant:

void PClassActor::SetPainChance(FName type, int chance)
{
	if (chance >= 0) 
	{
		if (PainChances == NULL)
		{
			PainChances = new PainChanceList;
		}
		PainChances->Insert(type, MIN(chance, 256));
	}
	else if (PainChances != NULL)
	{
		PainChances->Remove(type);
	}
}